

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void retstat(LexState *ls)

{
  int iVar1;
  int local_58;
  uint local_54;
  int nret;
  int first;
  expdesc e;
  FuncState *fs;
  LexState *ls_local;
  
  e._48_8_ = ls->fs;
  memset(&nret,0,0x38);
  e.t = -1;
  e.usertype._0_4_ = 0xffffffff;
  iVar1 = block_follow(ls,1);
  if ((iVar1 == 0) && ((ls->t).token != 0x3b)) {
    local_58 = explist(ls,(expdesc *)&nret);
    if ((nret == 0xd) || (nret == 0xe)) {
      luaK_setreturns((FuncState *)e._48_8_,(expdesc *)&nret,-1);
      if ((nret == 0xd) &&
         (((local_58 == 1 && (*(char *)(*(long *)(e._48_8_ + 0x18) + 0x13) == '\0')) &&
          (*(undefined1 *)(*(long *)(*(long *)e._48_8_ + 0x38) + (long)(int)e.k * 4) = 0x25,
          (*(uint *)(*(long *)(*(long *)e._48_8_ + 0x38) + (long)(int)e.k * 4) >> 8 & 0x7f) !=
          (uint)*(byte *)(e._48_8_ + 0x3a))))) {
        __assert_fail("((int)(((((fs)->f->code[(&e)->u.info]))>>8)&0x7f)) == fs->nactvar",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                      ,0x959,"void retstat(LexState *)");
      }
      local_54 = (uint)*(byte *)(e._48_8_ + 0x3a);
      local_58 = -1;
    }
    else if (local_58 == 1) {
      local_54 = luaK_exp2anyreg((FuncState *)e._48_8_,(expdesc *)&nret);
    }
    else {
      luaK_exp2nextreg((FuncState *)e._48_8_,(expdesc *)&nret);
      local_54 = (uint)*(byte *)(e._48_8_ + 0x3a);
      if (local_58 != *(byte *)(e._48_8_ + 0x3c) - local_54) {
        __assert_fail("nret == fs->freereg - first",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                      ,0x964,"void retstat(LexState *)");
      }
    }
  }
  else {
    local_58 = 0;
    local_54 = 0;
  }
  luaK_ret((FuncState *)e._48_8_,local_54,local_58);
  testnext(ls,0x3b);
  return;
}

Assistant:

static void retstat (LexState *ls) {
  /* stat -> RETURN [explist] [';'] */
  FuncState *fs = ls->fs;
  expdesc e = {.ravi_type_map = RAVI_TM_ANY, .pc = -1};
  int first, nret; /* registers with returned values */
  if (block_follow(ls, 1) || ls->t.token == ';')
    first = nret = 0;  /* return no values */
  else {
    nret = explist(ls, &e);  /* optional return values */
    if (hasmultret(e.k)) {
      luaK_setmultret(fs, &e);
      if (e.k == VCALL && nret == 1 && !fs->bl->insidetbc) {  /* tail call? */
        SET_OPCODE(getinstruction(fs,&e), OP_TAILCALL);
        lua_assert(GETARG_A(getinstruction(fs,&e)) == fs->nactvar);
      }
      first = fs->nactvar;
      nret = LUA_MULTRET;  /* return all values */
    }
    else {
      if (nret == 1)  /* only one single value? */
        first = luaK_exp2anyreg(fs, &e);
      else {
        luaK_exp2nextreg(fs, &e);  /* values must go to the stack */
        first = fs->nactvar;  /* return all active values */
        lua_assert(nret == fs->freereg - first);
      }
    }
  }
  luaK_ret(fs, first, nret);
  testnext(ls, ';');  /* skip optional semicolon */
}